

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

int av1_add_film_grain(aom_film_grain_t *params,aom_image_t *src,aom_image_t *dst)

{
  aom_img_fmt_t aVar1;
  aom_matrix_coefficients_t aVar2;
  uint uVar3;
  uchar *puVar4;
  short sVar5;
  bool bVar6;
  aom_transfer_characteristics_t aVar7;
  aom_chroma_sample_position_t aVar8;
  int *piVar9;
  int iVar10;
  int luma_stride;
  int chroma_stride;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int **ppiVar15;
  int *piVar16;
  int **ppiVar17;
  int *piVar18;
  int *left_block;
  int *piVar19;
  int *piVar20;
  int *__s;
  int *__s_00;
  int *__s_01;
  undefined8 *puVar21;
  byte bVar22;
  byte bVar24;
  byte bVar25;
  bool bVar26;
  int col;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  size_t sVar36;
  bool bVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  int j;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined4 uVar44;
  int iVar45;
  long lVar46;
  uchar *puVar47;
  ulong uVar48;
  long lVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  int iVar53;
  int iVar54;
  int k;
  int iVar55;
  uint uVar56;
  uint uVar57;
  int l;
  uint uVar59;
  int iVar60;
  long lVar61;
  int j_1;
  ulong uVar62;
  size_t sVar63;
  ulong uVar64;
  void *pvVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  int local_2e8;
  int local_2e0;
  int *local_1d0;
  int *cb_col_buf;
  int *y_col_buf;
  int *cr_line_buf;
  int *cb_line_buf;
  int *y_line_buf;
  int *cr_grain_block;
  int *cb_grain_block;
  int *luma_grain_block;
  int **pred_pos_chroma;
  int **pred_pos_luma;
  int *local_178;
  int *local_170;
  int *local_168;
  int *local_160;
  int local_154;
  int *local_150;
  ulong local_148;
  uchar *local_140;
  uchar *local_138;
  uchar *local_130;
  ulong local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  long local_110;
  ulong local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  long local_e8;
  long local_e0;
  uchar *local_d8;
  uchar *local_d0;
  uchar *local_c8;
  uchar *local_c0;
  uchar *local_b8;
  uchar *local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  ulong local_78;
  ulong local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  byte bVar23;
  ulong uVar58;
  
  aVar1 = src->fmt;
  aVar2 = src->mc;
  iVar55 = 0;
  bVar66 = true;
  bVar6 = true;
  switch(aVar1) {
  case AOM_IMG_FMT_I420:
  case AOM_IMG_FMT_AOMI420:
    local_2e0 = 1;
    local_2e8 = 1;
    break;
  case 0x103:
switchD_0016ee85_caseD_103:
    fwrite("Film grain error: input format is not supported!",0x30,1,_stderr);
    return -1;
  case AOM_IMG_FMT_I422:
    local_2e0 = 1;
    iVar55 = 0;
    bVar6 = bVar66;
    goto LAB_0016ef02;
  case AOM_IMG_FMT_I444:
    iVar55 = 0;
LAB_0016eef9:
    local_2e0 = 0;
    bVar6 = bVar66;
LAB_0016ef02:
    local_2e8 = 0;
    break;
  default:
    if (aVar1 == AOM_IMG_FMT_I44416) {
      bVar66 = false;
      iVar55 = 1;
      goto LAB_0016eef9;
    }
    if (aVar1 == AOM_IMG_FMT_I42216) {
      iVar55 = 1;
      local_2e0 = 1;
      bVar6 = false;
      goto LAB_0016ef02;
    }
    if (aVar1 != AOM_IMG_FMT_I42016) goto switchD_0016ee85_caseD_103;
    iVar55 = 1;
    bVar6 = false;
    local_2e0 = 1;
    local_2e8 = 1;
  }
  dst->fmt = aVar1;
  dst->r_h = src->r_h;
  uVar39 = src->d_w;
  uVar56 = src->d_h;
  uVar13 = src->r_w;
  uVar3 = src->d_w;
  uVar11 = src->d_h;
  dst->bit_depth = src->bit_depth;
  dst->d_w = uVar39;
  dst->d_h = uVar56;
  dst->r_w = uVar13;
  aVar7 = src->tc;
  dst->cp = src->cp;
  dst->tc = aVar7;
  dst->mc = aVar2;
  aVar8 = src->csp;
  dst->monochrome = src->monochrome;
  dst->csp = aVar8;
  dst->range = src->range;
  uVar39 = src->y_chroma_shift;
  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = uVar39;
  iVar10 = src->spatial_id;
  dst->temporal_id = src->temporal_id;
  dst->spatial_id = iVar10;
  copy_rect(src->planes[0],src->stride[0],dst->planes[0],dst->stride[0],uVar3,uVar11,iVar55);
  uVar39 = src->d_w;
  lVar52 = (long)(int)uVar39;
  uVar56 = src->d_h;
  if (((uVar56 | uVar39) & 1) != 0) {
    puVar4 = dst->planes[0];
    iVar10 = dst->stride[0];
    if (bVar6) {
      if ((uVar39 & 1) != 0) {
        uVar42 = 0;
        if (0 < (int)uVar56) {
          uVar42 = (ulong)uVar56;
        }
        puVar47 = puVar4 + lVar52;
        while (bVar66 = uVar42 != 0, uVar42 = uVar42 - 1, bVar66) {
          *puVar47 = puVar47[-1];
          puVar47 = puVar47 + iVar10;
        }
      }
      if ((uVar56 & 1) == 0) goto LAB_0016f022;
      lVar49 = (long)(int)(uVar56 * iVar10);
      lVar46 = (long)(int)((uVar56 - 1) * iVar10);
      sVar36 = (size_t)(int)(uVar39 + 1 & 0xfffffffe);
    }
    else {
      iVar10 = iVar10 / 2;
      if ((uVar39 & 1) != 0) {
        uVar39 = 0;
        if (0 < (int)uVar56) {
          uVar39 = uVar56;
        }
        uVar42 = (ulong)uVar39;
        puVar47 = puVar4 + lVar52 * 2;
        while (bVar66 = uVar42 != 0, uVar42 = uVar42 - 1, bVar66) {
          *(undefined2 *)puVar47 = *(undefined2 *)(puVar47 + -2);
          puVar47 = puVar47 + (long)iVar10 * 2;
        }
      }
      if ((uVar56 & 1) == 0) goto LAB_0016f022;
      lVar49 = (long)(int)(uVar56 * iVar10) * 2;
      lVar46 = (long)(int)((uVar56 - 1) * iVar10) * 2;
      sVar36 = (lVar52 + 1U & 0x7ffffffffffffffe) * 2;
    }
    memcpy(puVar4 + lVar49,puVar4 + lVar46,sVar36);
  }
LAB_0016f022:
  iVar38 = (uVar3 & 1) + uVar3;
  iVar10 = (uVar11 & 1) + uVar11;
  bVar22 = (byte)local_2e0;
  bVar23 = (byte)local_2e8;
  if (src->monochrome == 0) {
    copy_rect(src->planes[1],src->stride[1],dst->planes[1],dst->stride[1],iVar38 >> bVar22,
              iVar10 >> bVar23,iVar55);
    copy_rect(src->planes[2],src->stride[2],dst->planes[2],dst->stride[2],iVar38 >> bVar22,
              iVar10 >> bVar23,iVar55);
  }
  local_130 = dst->planes[0];
  local_138 = dst->planes[1];
  local_140 = dst->planes[2];
  luma_stride = dst->stride[0] >> (sbyte)iVar55;
  chroma_stride = dst->stride[1] >> (sbyte)iVar55;
  random_register = params->random_seed;
  uVar39 = 0x20 >> bVar22;
  uVar56 = 2 >> bVar23;
  uVar58 = (ulong)uVar56;
  uVar11 = 2 >> bVar22;
  uVar3 = params->bit_depth;
  iVar12 = 0x80 << ((char)uVar3 - 8U & 0x1f);
  iVar55 = params->overlap_flag;
  pred_pos_luma = (int **)0x0;
  pred_pos_chroma = (int **)0x0;
  luma_grain_block = (int *)0x0;
  cb_grain_block = (int *)0x0;
  cr_grain_block = (int *)0x0;
  y_line_buf = (int *)0x0;
  cb_line_buf = (int *)0x0;
  grain_min = -iVar12;
  cr_line_buf = (int *)0x0;
  y_col_buf = (int *)0x0;
  grain_max = iVar12 + -1;
  cb_col_buf = (int *)0x0;
  local_1d0 = (int *)0x0;
  uVar42 = 0;
  chroma_subblock_size_y = 0x20U >> bVar23;
  chroma_subblock_size_x = uVar39;
  memset(scaling_lut_y,0,0x400);
  memset(scaling_lut_cb,0,0x400);
  memset(scaling_lut_cr,0,0x400);
  sVar63 = ((long)params->ar_coeff_lag + 1) * (long)params->ar_coeff_lag * 2;
  iVar12 = params->num_y_points;
  ppiVar15 = (int **)aom_calloc(sVar63,8);
  if (ppiVar15 != (int **)0x0) {
    local_114 = uVar56 * 3 + 3;
    uVar13 = uVar56 * 3 + 3 + (0x20U >> bVar23) * 2;
    uVar33 = uVar11 * 3 + 3;
    local_38 = (ulong)uVar33;
    iVar60 = uVar39 * 2;
    iVar35 = uVar11 * 3 + uVar39 * 2;
    uVar39 = iVar35 + uVar33 + 3;
    uVar59 = (uint)(0 < iVar12) | (uint)sVar63;
    uVar62 = sVar63 & 0xffffffff;
    if ((int)(uint)sVar63 < 1) {
      uVar62 = 0;
    }
    do {
      if (uVar62 == uVar42) {
        ppiVar17 = (int **)aom_calloc((long)(int)uVar59,8);
        if (ppiVar17 != (int **)0x0) {
          uVar62 = 0;
          uVar42 = (ulong)uVar59;
          if ((int)uVar59 < 1) {
            uVar42 = uVar62;
          }
          goto LAB_0016f30a;
        }
        break;
      }
      piVar16 = (int *)aom_malloc(0xc);
      ppiVar15[uVar42] = piVar16;
      uVar42 = uVar42 + 1;
    } while (piVar16 != (int *)0x0);
LAB_0016f6c5:
    dealloc_arrays(params,&pred_pos_luma,&pred_pos_chroma,&luma_grain_block,&cb_grain_block,
                   &cr_grain_block,&y_line_buf,&cb_line_buf,&cr_line_buf,&y_col_buf,&cb_col_buf,
                   &local_1d0);
  }
  return -1;
LAB_0016f30a:
  if (uVar42 != uVar62) goto code_r0x0016f313;
  iVar12 = params->ar_coeff_lag;
  iVar34 = -iVar12;
  lVar52 = 0;
  iVar14 = 0;
  if (iVar12 < 0) {
    iVar14 = iVar34;
  }
  while( true ) {
    iVar27 = -iVar12;
    lVar49 = (long)(int)lVar52;
    if (iVar34 == iVar14) break;
    for (; iVar27 <= iVar12; iVar27 = iVar27 + 1) {
      piVar16 = ppiVar15[lVar49];
      *piVar16 = iVar34;
      piVar16[1] = iVar27;
      piVar16[2] = 0;
      piVar16 = ppiVar17[lVar49];
      *piVar16 = iVar34;
      piVar16[1] = iVar27;
      piVar16[2] = 0;
      lVar49 = lVar49 + 1;
      iVar12 = params->ar_coeff_lag;
    }
    iVar34 = iVar34 + 1;
    lVar52 = lVar49;
  }
  iVar14 = 0;
  if (iVar12 < 0) {
    iVar14 = iVar27;
  }
  lVar52 = lVar52 << 0x20;
  uVar44 = 0;
  for (; iVar14 != iVar27; iVar27 = iVar27 + 1) {
    piVar16 = ppiVar15[lVar49];
    *piVar16 = 0;
    piVar16[1] = iVar27;
    piVar16[2] = 0;
    piVar16 = ppiVar17[lVar49];
    *piVar16 = 0;
    piVar16[1] = iVar27;
    piVar16[2] = 0;
    lVar49 = lVar49 + 1;
    lVar52 = lVar52 + 0x100000000;
  }
  if (0 < params->num_y_points) {
    puVar21 = *(undefined8 **)((long)ppiVar17 + (lVar52 >> 0x1d));
    *puVar21 = 0;
    *(undefined4 *)(puVar21 + 1) = 1;
  }
  local_110 = (long)luma_stride;
  pred_pos_chroma = ppiVar17;
  pred_pos_luma = ppiVar15;
  piVar16 = (int *)aom_malloc(local_110 * 8);
  lVar52 = (long)chroma_stride;
  sVar63 = uVar58 * lVar52 * 4;
  y_line_buf = piVar16;
  piVar18 = (int *)aom_malloc(sVar63);
  cb_line_buf = piVar18;
  cr_line_buf = (int *)aom_malloc(sVar63);
  local_160 = cr_line_buf;
  left_block = (int *)aom_malloc(0x110);
  uVar42 = (ulong)(uVar11 * 4);
  y_col_buf = left_block;
  piVar19 = (int *)aom_malloc((chroma_subblock_size_y + uVar56) * uVar42);
  cb_col_buf = piVar19;
  local_128 = uVar42;
  piVar20 = (int *)aom_malloc((chroma_subblock_size_y + uVar56) * uVar42);
  local_1d0 = piVar20;
  __s = (int *)aom_malloc(0x5d88);
  uVar42 = (ulong)(uVar13 * uVar39 * 4);
  luma_grain_block = __s;
  __s_00 = (int *)aom_malloc(uVar42);
  cb_grain_block = __s_00;
  __s_01 = (int *)aom_malloc(uVar42);
  auVar67._0_4_ = -(uint)((int)((ulong)piVar16 >> 0x20) == 0 && (int)piVar16 == 0);
  auVar67._4_4_ = -(uint)((int)piVar18 == 0 && (int)((ulong)piVar18 >> 0x20) == 0);
  auVar67._8_4_ = -(uint)((int)((ulong)local_160 >> 0x20) == 0 && (int)local_160 == 0);
  auVar67._12_4_ = -(uint)((int)left_block == 0 && (int)((ulong)left_block >> 0x20) == 0);
  iVar12 = movmskps(uVar44,auVar67);
  cr_grain_block = __s_01;
  local_170 = piVar20;
  local_168 = piVar19;
  if ((((piVar20 != (int *)0x0 && piVar19 != (int *)0x0) && __s != (int *)0x0) && iVar12 == 0) &&
     (__s_01 != (int *)0x0 && __s_00 != (int *)0x0)) {
    if (params->num_y_points == 0) {
      memset(__s,0,0x5d88);
    }
    else {
      bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
      iVar12 = params->ar_coeff_lag;
      iVar14 = params->ar_coeff_shift;
      piVar19 = __s;
      for (lVar49 = 0; iVar27 = grain_max, iVar34 = grain_min, lVar49 != 0x49; lVar49 = lVar49 + 1)
      {
        for (lVar46 = 0; lVar46 != 0x52; lVar46 = lVar46 + 1) {
          uVar59 = get_random_number(0xb);
          piVar19[lVar46] =
               gaussian_sequence[uVar59] + ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
        }
        piVar19 = piVar19 + 0x52;
      }
      uVar59 = (iVar12 + 1) * iVar12 * 2;
      uVar62 = 0;
      if (0 < (int)uVar59) {
        uVar62 = (ulong)uVar59;
      }
      for (lVar49 = 3; lVar46 = 3, lVar49 != 0x49; lVar49 = lVar49 + 1) {
        for (; lVar46 != 0x4f; lVar46 = lVar46 + 1) {
          iVar12 = 0;
          for (uVar30 = 0; uVar62 != uVar30; uVar30 = uVar30 + 1) {
            iVar12 = iVar12 + __s[ppiVar15[uVar30][1] + (int)lVar46 +
                                  (*ppiVar15[uVar30] + (int)lVar49) * 0x52] *
                              params->ar_coeffs_y[uVar30];
          }
          iVar53 = (iVar12 + (1 << ((char)iVar14 - 1U & 0x1f)) >>
                   ((byte)params->ar_coeff_shift & 0x1f)) + __s[lVar49 * 0x52 + lVar46];
          iVar12 = iVar27;
          if (iVar53 < iVar27) {
            iVar12 = iVar53;
          }
          if (iVar53 < iVar34) {
            iVar12 = iVar34;
          }
          __s[lVar49 * 0x52 + lVar46] = iVar12;
        }
      }
    }
    bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
    iVar12 = params->ar_coeff_lag;
    iVar14 = params->num_y_points;
    iVar34 = 1 << ((char)params->ar_coeff_shift - 1U & 0x1f);
    uVar62 = (ulong)uVar13;
    if ((params->num_cb_points == 0) && (params->chroma_scaling_from_luma == 0)) {
      memset(__s_00,0,uVar42);
    }
    else {
      random_register = (ushort)*(undefined4 *)&params->random_seed ^ 0xb524;
      piVar19 = __s_00;
      for (uVar30 = 0; uVar30 != uVar62; uVar30 = uVar30 + 1) {
        for (uVar64 = 0; uVar11 * 6 + iVar60 + 6 != uVar64; uVar64 = uVar64 + 1) {
          uVar13 = get_random_number(0xb);
          piVar19[uVar64] =
               gaussian_sequence[uVar13] + ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
        }
        piVar19 = (int *)((long)piVar19 + (ulong)((uVar11 * 6 + iVar60) * 4 + 0x18));
      }
    }
    if ((params->num_cr_points == 0) && (params->chroma_scaling_from_luma == 0)) {
      memset(__s_01,0,uVar42);
    }
    else {
      random_register = (ushort)*(undefined4 *)&params->random_seed ^ 0x49d8;
      piVar19 = __s_01;
      for (uVar42 = 0; uVar42 != uVar62; uVar42 = uVar42 + 1) {
        for (uVar30 = 0; uVar11 * 6 + iVar60 + 6 != uVar30; uVar30 = uVar30 + 1) {
          uVar13 = get_random_number(0xb);
          piVar19[uVar30] =
               gaussian_sequence[uVar13] + ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
        }
        piVar19 = (int *)((long)piVar19 + (ulong)((uVar11 * 6 + iVar60) * 4 + 0x18));
      }
    }
    iVar53 = grain_max;
    iVar27 = grain_min;
    uVar13 = (iVar12 + 1) * iVar12 * 2 | (uint)(0 < iVar14);
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    for (uVar42 = 3; uVar30 = 3, uVar42 != uVar62; uVar42 = uVar42 + 1) {
      iVar12 = (int)uVar42 + -3 << bVar23;
      lVar49 = (long)(iVar12 + 3);
      local_178 = __s_00 + uVar42 * uVar39;
      local_150 = __s_01 + uVar42 * uVar39;
      for (; uVar30 < iVar35 + uVar33; uVar30 = uVar30 + 1) {
        iVar14 = (int)uVar30 + -3 << bVar22;
        iVar50 = 0;
        iVar54 = 0;
        for (uVar64 = 0; uVar64 != uVar13; uVar64 = uVar64 + 1) {
          piVar19 = ppiVar17[uVar64];
          if (piVar19[2] == 0) {
            iVar28 = piVar19[1] + (int)uVar30 + (*piVar19 + (int)uVar42) * uVar39;
            iVar29 = __s_00[iVar28] * params->ar_coeffs_cb[uVar64];
            iVar45 = params->ar_coeffs_cr[uVar64];
            piVar19 = __s_01 + iVar28;
          }
          else {
            if (piVar19[2] != 1) {
              fwrite("Grain synthesis: prediction between two chroma components is not supported!",
                     0x4b,1,_stderr);
              return -1;
            }
            iVar45 = 0;
            piVar19 = __s + lVar49 * 0x52;
            for (lVar46 = lVar49; lVar61 = (long)(iVar14 + 3), lVar46 <= local_2e8 + iVar12 + 3;
                lVar46 = lVar46 + 1) {
              for (; lVar61 <= local_2e0 + iVar14 + 3; lVar61 = lVar61 + 1) {
                iVar45 = iVar45 + piVar19[lVar61];
              }
              piVar19 = piVar19 + 0x52;
            }
            iVar45 = (int)(iVar45 + ((uint)(1 << bVar23 + bVar22) >> 1)) >> bVar23 + bVar22;
            iVar29 = params->ar_coeffs_cb[uVar64] * iVar45;
            piVar19 = params->ar_coeffs_cr + uVar64;
          }
          iVar54 = iVar54 + iVar45 * *piVar19;
          iVar50 = iVar50 + iVar29;
        }
        if ((params->num_cb_points != 0) || (params->chroma_scaling_from_luma != 0)) {
          iVar50 = (iVar50 + iVar34 >> ((byte)params->ar_coeff_shift & 0x1f)) + local_178[uVar30];
          iVar14 = iVar53;
          if (iVar50 < iVar53) {
            iVar14 = iVar50;
          }
          if (iVar50 < iVar27) {
            iVar14 = iVar27;
          }
          local_178[uVar30] = iVar14;
        }
        if ((params->num_cr_points != 0) || (params->chroma_scaling_from_luma != 0)) {
          iVar50 = (iVar54 + iVar34 >> ((byte)params->ar_coeff_shift & 0x1f)) + local_150[uVar30];
          iVar14 = iVar53;
          if (iVar50 < iVar53) {
            iVar14 = iVar50;
          }
          if (iVar50 < iVar27) {
            iVar14 = iVar27;
          }
          local_150[uVar30] = iVar14;
        }
      }
    }
    init_scaling_function(params->scaling_points_y,params->num_y_points,scaling_lut_y);
    if (params->chroma_scaling_from_luma == 0) {
      init_scaling_function(params->scaling_points_cb,params->num_cb_points,scaling_lut_cb);
      init_scaling_function(params->scaling_points_cr,params->num_cr_points,scaling_lut_cr);
    }
    else {
      memcpy(scaling_lut_cb,scaling_lut_y,0x400);
      memcpy(scaling_lut_cr,scaling_lut_y,0x400);
    }
    lVar49 = local_110;
    local_11c = iVar10 / 2;
    iVar14 = iVar38 / 2;
    iVar12 = (int)local_110 * 2;
    bVar24 = bVar23 ^ 1;
    bVar25 = bVar22 ^ 1;
    local_120 = 2 - local_2e8;
    local_148 = (ulong)(2 - local_2e0);
    local_40 = (long)iVar14;
    local_e0 = (long)local_11c;
    local_58 = __s + 0xd2b;
    local_150 = (int *)CONCAT44(local_150._4_4_,uVar11 * 6 + iVar60 + 6);
    local_60 = __s_00 + 3;
    uVar42 = (ulong)((uVar11 * 6 + iVar60) * 4 + 0x18);
    local_68 = __s_01 + 3;
    uVar62 = 0;
    iVar35 = iVar10;
    local_78 = (ulong)uVar11;
    do {
      local_50 = (long)iVar35;
      if (0x21 < (long)iVar35) {
        local_50 = 0x22;
      }
      if (local_e0 <= (long)uVar62) {
        dealloc_arrays(params,&pred_pos_luma,&pred_pos_chroma,&luma_grain_block,&cb_grain_block,
                       &cr_grain_block,&y_line_buf,&cb_line_buf,&cr_line_buf,&y_col_buf,&cb_col_buf,
                       &local_1d0);
        return 0;
      }
      uVar33 = (uint)uVar62;
      sVar5 = (short)(uVar62 >> 4);
      random_register =
           sVar5 * 0x2500 + (sVar5 * 0xad + 0x69U & 0xff) + 0xb200 ^ params->random_seed;
      uVar13 = iVar10 + uVar33 * -2;
      local_70 = 0x22;
      if ((int)uVar13 < 0x22) {
        local_70 = (ulong)uVar13;
      }
      iVar34 = (int)uVar13 >> bVar23;
      bVar66 = uVar62 != 0;
      iVar60 = 0;
      if (bVar66) {
        iVar60 = local_120;
      }
      uVar13 = bVar66 | uVar33;
      lVar46 = (long)(int)(uVar13 * iVar12);
      local_88 = local_130 + lVar46 * 2;
      lVar61 = (long)(int)((uVar13 << bVar24) * chroma_stride);
      local_98 = local_138 + lVar61 * 2;
      local_a0 = local_140 + lVar61 * 2;
      local_f8 = left_block + (ulong)bVar66 * 4;
      uVar30 = (ulong)(uint)(iVar60 * (int)local_148 * 4);
      local_100 = (int *)((long)local_168 + uVar30);
      local_f0 = (int *)(uVar30 + (long)local_170);
      local_154 = local_11c - uVar33;
      if (0xf < local_154) {
        local_154 = 0x10;
      }
      local_108 = (ulong)(local_154 - (uint)bVar66);
      local_80 = local_130 + lVar46;
      bVar37 = bVar66 && iVar55 != 0;
      local_a8 = local_138 + lVar61;
      local_90 = local_140 + lVar61;
      lVar61 = (long)(int)(uVar33 * 2 * luma_stride);
      lVar46 = (long)(int)((uVar33 << bVar24) * chroma_stride);
      local_c0 = local_130 + lVar61 * 2;
      local_b0 = local_130 + lVar61;
      local_c8 = local_138 + lVar46 * 2;
      local_d0 = local_140 + lVar46 * 2;
      local_d8 = local_138 + lVar46;
      local_b8 = local_140 + lVar46;
      local_118 = iVar35;
      for (uVar30 = 0; (long)uVar30 < local_40; uVar30 = uVar30 + 0x10) {
        uVar13 = get_random_number(8);
        uVar59 = uVar13 >> 4 & 0xf;
        uVar13 = uVar13 & 0xf;
        local_178 = (int *)(ulong)uVar13;
        iVar35 = uVar13 * 2 + 9;
        iVar27 = uVar13 * uVar56 + local_114;
        iVar60 = uVar59 * uVar11 + (int)local_38;
        bVar26 = uVar30 != 0 && iVar55 != 0;
        uVar64 = (ulong)(uVar59 * 2 + 9);
        uVar13 = (uint)uVar30;
        uVar57 = (uint)(aVar2 == AOM_CICP_MC_IDENTITY);
        if (uVar30 != 0 && iVar55 != 0) {
          ver_boundary_overlap
                    (left_block,2,(int *)((long)__s + uVar64 * 4 + (ulong)(uint)(iVar35 * 0x148)),
                     0x52,left_block,2,2,(int)local_70);
          uVar31 = (ulong)(iVar27 * uVar39 * 4);
          iVar53 = chroma_subblock_size_y + uVar56;
          if (iVar34 <= (int)(chroma_subblock_size_y + uVar56)) {
            iVar53 = iVar34;
          }
          ver_boundary_overlap
                    (local_168,uVar11,(int *)((long)__s_00 + uVar31 + (uint)(iVar60 * 4)),uVar39,
                     local_168,uVar11,uVar11,iVar53);
          iVar53 = chroma_subblock_size_y + uVar56;
          if (iVar34 <= (int)(chroma_subblock_size_y + uVar56)) {
            iVar53 = iVar34;
          }
          ver_boundary_overlap
                    (local_170,uVar11,(int *)((long)__s_01 + uVar31 + (uint)(iVar60 * 4)),uVar39,
                     local_170,uVar11,uVar11,iVar53);
          lVar46 = (long)(int)(uVar13 * 2);
          lVar61 = (long)(int)(uVar13 << bVar25);
          if (bVar6) {
            add_noise_to_block(params,local_80 + lVar46,local_a8 + lVar61,local_90 + lVar61,
                               luma_stride,chroma_stride,local_f8,local_100,local_f0,2,
                               (int)local_148,(int)local_108,1,uVar3,local_2e8,local_2e0,uVar57);
            uVar40 = 1;
            if (!bVar66 || iVar55 == 0) goto LAB_001706ea;
LAB_001703f8:
            uVar31 = uVar30 & 0xffffffff;
            local_e8 = lVar46;
            hor_boundary_overlap
                      (piVar16 + lVar46,luma_stride,left_block,2,piVar16 + lVar46,luma_stride,2,2);
            lVar46 = uVar30 * local_78;
            hor_boundary_overlap
                      (piVar18 + lVar46,chroma_stride,local_168,uVar11,piVar18 + lVar46,
                       chroma_stride,uVar11,uVar56);
            hor_boundary_overlap
                      (local_160 + lVar46,chroma_stride,local_170,uVar11,local_160 + lVar46,
                       chroma_stride,uVar11,uVar56);
            iVar53 = 0x1e;
            lVar46 = 2;
LAB_001704ad:
            uVar41 = (uint)uVar31;
            uVar40 = uVar41 | 1;
            if (uVar30 == 0) {
              uVar40 = 0;
            }
            iVar50 = iVar38 + uVar40 * -2;
            if (iVar50 <= iVar53) {
              iVar53 = iVar50;
            }
            hor_boundary_overlap
                      (piVar16 + (int)(uVar40 * 2),luma_stride,
                       (int *)((long)__s + lVar46 * 4 + uVar64 * 4 + (ulong)(uint)(iVar35 * 0x148)),
                       0x52,piVar16 + (int)(uVar40 * 2),luma_stride,iVar53,2);
            local_48 = (long)(int)(uVar40 << bVar25);
            uVar43 = (ulong)(iVar27 * uVar39 * 4);
            uVar40 = (uint)(uVar30 != 0) << bVar25;
            iVar50 = iVar50 >> bVar22;
            iVar53 = chroma_subblock_size_x - uVar40;
            if (iVar50 <= (int)(chroma_subblock_size_x - uVar40)) {
              iVar53 = iVar50;
            }
            hor_boundary_overlap
                      (piVar18 + local_48,chroma_stride,
                       (int *)((long)__s_00 + (ulong)uVar40 * 4 + uVar43 + (uint)(iVar60 * 4)),
                       uVar39,piVar18 + local_48,chroma_stride,iVar53,uVar56);
            piVar19 = local_160;
            iVar53 = chroma_subblock_size_x - uVar40;
            if (iVar50 <= (int)(chroma_subblock_size_x - uVar40)) {
              iVar53 = iVar50;
            }
            hor_boundary_overlap
                      (local_160 + local_48,chroma_stride,
                       (int *)((long)__s_01 + (ulong)uVar40 * 4 + uVar43 + (uint)(iVar60 * 4)),
                       uVar39,local_160 + local_48,chroma_stride,iVar53,uVar56);
            lVar46 = (long)(int)(uVar41 << bVar25);
            iVar53 = iVar14 - uVar41;
            if (0xf < iVar53) {
              iVar53 = 0x10;
            }
            if (bVar6) {
              add_noise_to_block(params,local_b0 + local_e8,local_d8 + lVar46,local_b8 + lVar46,
                                 luma_stride,chroma_stride,piVar16 + local_e8,piVar18 + lVar46,
                                 piVar19 + lVar46,luma_stride,chroma_stride,1,iVar53,uVar3,local_2e8
                                 ,local_2e0,uVar57);
              iVar50 = 2;
              uVar40 = (uint)bVar26;
              uVar51 = 1;
              goto LAB_00170722;
            }
            add_noise_to_block_hbd
                      (params,(uint16_t *)(local_c0 + local_e8 * 2),
                       (uint16_t *)(local_c8 + lVar46 * 2),(uint16_t *)(local_d0 + lVar46 * 2),
                       luma_stride,chroma_stride,piVar16 + local_e8,piVar18 + lVar46,
                       piVar19 + lVar46,luma_stride,chroma_stride,1,iVar53,uVar3,local_2e8,local_2e0
                       ,uVar57);
            iVar50 = 2;
            uVar40 = (uint)bVar26;
            uVar51 = 1;
          }
          else {
            add_noise_to_block_hbd
                      (params,(uint16_t *)(local_88 + lVar46 * 2),
                       (uint16_t *)(local_98 + lVar61 * 2),(uint16_t *)(local_a0 + lVar61 * 2),
                       luma_stride,chroma_stride,local_f8,local_100,local_f0,2,(int)local_148,
                       (int)local_108,1,uVar3,local_2e8,local_2e0,uVar57);
            uVar40 = 1;
            if (bVar37) goto LAB_001703f8;
LAB_001708d9:
            iVar53 = iVar14 - uVar13;
            if (0xf < iVar53) {
              iVar53 = 0x10;
            }
            iVar50 = 0;
            uVar51 = 0;
            uVar41 = uVar13;
          }
          lVar46 = (long)(int)(((uVar51 | uVar33) << bVar24) * chroma_stride);
          lVar61 = (long)(int)((uVar41 | uVar40) << bVar25);
          uVar31 = (ulong)(((uVar51 << bVar24) + iVar27) * uVar39);
          add_noise_to_block_hbd
                    (params,(uint16_t *)
                            (local_130 +
                            (long)(int)((uVar41 | uVar40) * 2) * 2 +
                            (long)(int)((uVar51 | uVar33) * iVar12) * 2),
                     (uint16_t *)(local_138 + lVar61 * 2 + lVar46 * 2),
                     (uint16_t *)(local_140 + lVar61 * 2 + lVar46 * 2),luma_stride,chroma_stride,
                     (int *)((long)__s +
                            (ulong)bVar26 * 8 +
                            uVar64 * 4 + (ulong)(uint)((iVar50 + iVar35) * 0x148)),
                     (int *)((long)__s_00 +
                            (ulong)(uVar40 << bVar25) * 4 + (ulong)(uint)(iVar60 * 4) + uVar31 * 4),
                     (int *)((long)__s_01 +
                            (ulong)(uVar40 << bVar25) * 4 + (ulong)(uint)(iVar60 * 4) + uVar31 * 4),
                     0x52,uVar39,local_154 - uVar51,iVar53 - uVar40,uVar3,local_2e8,local_2e0,uVar57
                    );
        }
        else {
          if (bVar37) {
            if (uVar30 != 0) {
              lVar46 = (long)(int)(uVar13 * 2);
              goto LAB_001703f8;
            }
            local_e8 = 0;
            uVar31 = 0;
            iVar53 = 0x20;
            lVar46 = 0;
            goto LAB_001704ad;
          }
          uVar40 = 0;
          if (!bVar6) goto LAB_001708d9;
LAB_001706ea:
          iVar53 = iVar14 - uVar13;
          if (0xf < iVar53) {
            iVar53 = 0x10;
          }
          iVar50 = 0;
          uVar51 = 0;
          uVar31 = uVar30;
LAB_00170722:
          uVar41 = (uint)uVar31 | uVar40;
          lVar61 = (long)(int)(((uVar51 | uVar33) << bVar24) * chroma_stride);
          lVar46 = (long)(int)(uVar41 << bVar25);
          uVar31 = (ulong)(((uVar51 << bVar24) + iVar27) * uVar39);
          add_noise_to_block(params,local_130 +
                                    (long)(int)((uVar51 | uVar33) * iVar12) +
                                    (long)(int)(uVar41 * 2),local_138 + lVar61 + lVar46,
                             local_140 + lVar61 + lVar46,luma_stride,chroma_stride,
                             (int *)((long)__s +
                                    (ulong)bVar26 * 8 +
                                    uVar64 * 4 + (ulong)(uint)((iVar50 + iVar35) * 0x148)),
                             (int *)((long)__s_00 +
                                    (ulong)(uVar40 << bVar25) * 4 +
                                    (ulong)(uint)(iVar60 * 4) + uVar31 * 4),
                             (int *)((long)__s_01 +
                                    (ulong)(uVar40 << bVar25) * 4 +
                                    (ulong)(uint)(iVar60 * 4) + uVar31 * 4),0x52,uVar39,
                             local_154 - uVar51,iVar53 - uVar40,uVar3,local_2e8,local_2e0,uVar57);
        }
        if (iVar55 != 0) {
          if (uVar30 == 0) {
            uVar13 = 0;
            iVar60 = 0;
            uVar57 = 0;
          }
          else {
            iVar60 = uVar13 * 2;
            *(undefined8 *)(piVar16 + iVar60) = *(undefined8 *)(left_block + 0x40);
            *(undefined8 *)(piVar16 + iVar60 + local_110) = *(undefined8 *)(left_block + 0x42);
            uVar57 = chroma_subblock_size_y << bVar25;
            piVar19 = local_168 + uVar57;
            piVar20 = piVar18 + (int)(uVar13 << bVar25);
            uVar31 = uVar58;
            while (uVar43 = local_128, iVar53 = (int)uVar31, uVar31 = (ulong)(iVar53 - 1),
                  iVar53 != 0) {
              memcpy(piVar20,piVar19,local_128);
              piVar20 = piVar20 + lVar52;
              piVar19 = (int *)((long)piVar19 + uVar43);
            }
            piVar19 = local_170 + uVar57;
            piVar20 = local_160 + (int)(uVar13 << bVar25);
            uVar31 = uVar58;
            while (iVar53 = (int)uVar31, uVar31 = (ulong)(iVar53 - 1), iVar53 != 0) {
              memcpy(piVar20,piVar19,uVar43);
              piVar20 = piVar20 + lVar52;
              piVar19 = (int *)((long)piVar19 + uVar43);
            }
            uVar13 = uVar13 | 1;
            uVar57 = 2;
          }
          piVar20 = local_58;
          piVar19 = piVar16 + (int)(uVar13 * 2);
          iVar60 = iVar38 - iVar60;
          iVar53 = 0x20;
          if (iVar60 < 0x20) {
            iVar53 = iVar60;
          }
          lVar46 = (long)local_178 * 0x290;
          for (lVar61 = 0; piVar9 = local_60, iVar50 = chroma_subblock_size_y, (int)lVar61 != 0x290;
              lVar61 = lVar61 + 0x148) {
            memcpy(piVar19,(void *)((long)piVar20 +
                                   lVar61 + lVar46 + (ulong)uVar59 * 8 + (ulong)uVar57 * 4),
                   (long)(int)(iVar53 - uVar57) << 2);
            piVar19 = piVar19 + lVar49;
          }
          uVar57 = 0;
          if (uVar30 != 0) {
            uVar57 = uVar11;
          }
          local_178 = (int *)(long)(int)(uVar13 << bVar25);
          piVar19 = piVar18 + (long)local_178;
          uVar31 = (ulong)(uint)chroma_subblock_size_x;
          iVar53 = iVar60 >> bVar22;
          if (chroma_subblock_size_x < iVar60 >> bVar22) {
            iVar53 = chroma_subblock_size_x;
          }
          sVar36 = (long)(int)(iVar53 - uVar57) << 2;
          uVar48 = (ulong)(uint)((chroma_subblock_size_y + iVar27) * (int)local_150);
          uVar32 = (ulong)((uVar59 + 3) * uVar11 * 4);
          pvVar65 = (void *)((long)local_60 + (ulong)(uVar57 << 2) + uVar48 * 4 + uVar32);
          uVar43 = uVar58;
          while (piVar20 = local_68, iVar60 = (int)uVar43, uVar43 = (ulong)(iVar60 - 1), iVar60 != 0
                ) {
            memcpy(piVar19,pvVar65,sVar36);
            piVar19 = piVar19 + lVar52;
            pvVar65 = (void *)((long)pvVar65 + uVar42);
          }
          piVar19 = local_160 + (long)local_178;
          pvVar65 = (void *)((long)local_68 + (ulong)(uVar57 << 2) + uVar48 * 4 + uVar32);
          uVar43 = uVar58;
          while (uVar48 = local_128, iVar60 = (int)uVar43, uVar43 = (ulong)(iVar60 - 1), iVar60 != 0
                ) {
            memcpy(piVar19,pvVar65,sVar36);
            piVar19 = piVar19 + lVar52;
            pvVar65 = (void *)((long)pvVar65 + uVar42);
          }
          puVar21 = (undefined8 *)((long)__s + uVar64 * 4 + (ulong)(uint)(iVar35 * 0x148) + 0x80);
          for (lVar46 = 0; (int)local_50 != (int)lVar46; lVar46 = lVar46 + 1) {
            *(undefined8 *)(left_block + lVar46 * 2) = *puVar21;
            puVar21 = puVar21 + 0x29;
          }
          iVar35 = iVar50 + uVar56;
          if (iVar34 <= (int)(iVar50 + uVar56)) {
            iVar35 = iVar34;
          }
          uVar13 = iVar27 * (int)local_150;
          pvVar65 = (void *)((long)piVar9 + (ulong)uVar13 * 4 + uVar31 * 4 + uVar32);
          piVar19 = local_168;
          iVar60 = iVar35;
          while (bVar26 = iVar60 != 0, iVar60 = iVar60 + -1, bVar26) {
            memcpy(piVar19,pvVar65,uVar48);
            piVar19 = (int *)((long)piVar19 + uVar48);
            pvVar65 = (void *)((long)pvVar65 + uVar42);
          }
          pvVar65 = (void *)((long)piVar20 + uVar31 * 4 + (ulong)uVar13 * 4 + uVar32);
          piVar19 = local_170;
          while (bVar26 = iVar35 != 0, iVar35 = iVar35 + -1, bVar26) {
            memcpy(piVar19,pvVar65,uVar48);
            piVar19 = (int *)((long)piVar19 + uVar48);
            pvVar65 = (void *)((long)pvVar65 + uVar42);
          }
        }
      }
      uVar62 = uVar62 + 0x10;
      iVar35 = local_118 + -0x20;
    } while( true );
  }
  goto LAB_0016f6c5;
code_r0x0016f313:
  piVar16 = (int *)aom_malloc(0xc);
  ppiVar17[uVar62] = piVar16;
  uVar62 = uVar62 + 1;
  if (piVar16 == (int *)0x0) goto LAB_0016f6c5;
  goto LAB_0016f30a;
}

Assistant:

int av1_add_film_grain(const aom_film_grain_t *params, const aom_image_t *src,
                       aom_image_t *dst) {
  uint8_t *luma, *cb, *cr;
  int height, width, luma_stride, chroma_stride;
  int use_high_bit_depth = 0;
  int chroma_subsamp_x = 0;
  int chroma_subsamp_y = 0;
  int mc_identity = src->mc == AOM_CICP_MC_IDENTITY ? 1 : 0;

  switch (src->fmt) {
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_I420:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
    case AOM_IMG_FMT_I42016:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
      //    case AOM_IMG_FMT_444A:
    case AOM_IMG_FMT_I444:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I44416:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I422:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I42216:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    default:  // unknown input format
      fprintf(stderr, "Film grain error: input format is not supported!");
      return -1;
  }

  assert(params->bit_depth == src->bit_depth);

  dst->fmt = src->fmt;
  dst->bit_depth = src->bit_depth;

  dst->r_w = src->r_w;
  dst->r_h = src->r_h;
  dst->d_w = src->d_w;
  dst->d_h = src->d_h;

  dst->cp = src->cp;
  dst->tc = src->tc;
  dst->mc = src->mc;

  dst->monochrome = src->monochrome;
  dst->csp = src->csp;
  dst->range = src->range;

  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = src->y_chroma_shift;

  dst->temporal_id = src->temporal_id;
  dst->spatial_id = src->spatial_id;

  width = src->d_w % 2 ? src->d_w + 1 : src->d_w;
  height = src->d_h % 2 ? src->d_h + 1 : src->d_h;

  copy_rect(src->planes[AOM_PLANE_Y], src->stride[AOM_PLANE_Y],
            dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
            src->d_h, use_high_bit_depth);
  // Note that dst is already assumed to be aligned to even.
  extend_even(dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
              src->d_h, use_high_bit_depth);

  if (!src->monochrome) {
    copy_rect(src->planes[AOM_PLANE_U], src->stride[AOM_PLANE_U],
              dst->planes[AOM_PLANE_U], dst->stride[AOM_PLANE_U],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);

    copy_rect(src->planes[AOM_PLANE_V], src->stride[AOM_PLANE_V],
              dst->planes[AOM_PLANE_V], dst->stride[AOM_PLANE_V],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);
  }

  luma = dst->planes[AOM_PLANE_Y];
  cb = dst->planes[AOM_PLANE_U];
  cr = dst->planes[AOM_PLANE_V];

  // luma and chroma strides in samples
  luma_stride = dst->stride[AOM_PLANE_Y] >> use_high_bit_depth;
  chroma_stride = dst->stride[AOM_PLANE_U] >> use_high_bit_depth;

  return add_film_grain_run(params, luma, cb, cr, height, width, luma_stride,
                            chroma_stride, use_high_bit_depth, chroma_subsamp_y,
                            chroma_subsamp_x, mc_identity);
}